

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackPropertiesGenerator.cxx
# Opt level: O3

void __thiscall
cmCPackPropertiesGenerator::GenerateScriptForConfig
          (cmCPackPropertiesGenerator *this,ostream *os,string *config,Indent indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  pointer pcVar3;
  cmCompiledGeneratorExpression *this_00;
  ostream *poVar4;
  string *psVar5;
  Indent IVar6;
  _Base_ptr p_Var7;
  string value;
  string local_78;
  _Base_ptr local_58;
  cmCPackPropertiesGenerator *local_50;
  _Base_ptr local_48;
  string *local_40;
  string *local_38;
  
  this_00 = cmInstalledFile::GetNameExpression(this->InstalledFile);
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  value._M_dataplus._M_p = (pointer)&value.field_2;
  local_50 = this;
  local_38 = config;
  local_40 = cmCompiledGeneratorExpression::Evaluate
                       (this_00,this->LG,config,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value._M_dataplus._M_p != &value.field_2) {
    operator_delete(value._M_dataplus._M_p,
                    CONCAT71(value.field_2._M_allocated_capacity._1_7_,value.field_2._M_local_buf[0]
                            ) + 1);
  }
  local_58 = (local_50->InstalledFile->Properties)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
  local_48 = &(local_50->InstalledFile->Properties)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_58 != local_48) {
    paVar1 = &local_78.field_2;
    do {
      IVar6.Level = indent.Level;
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          IVar6.Level = IVar6.Level + -1;
        } while (IVar6.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(INSTALL ",0x15);
      cmOutputConverter::EscapeForCMake(&value,local_40);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,value._M_dataplus._M_p,value._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," PROPERTY ",10);
      p_Var7 = local_58;
      cmOutputConverter::EscapeForCMake(&local_78,(string *)(local_58 + 1));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,local_78._M_dataplus._M_p,local_78._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value._M_dataplus._M_p != &value.field_2) {
        operator_delete(value._M_dataplus._M_p,
                        CONCAT71(value.field_2._M_allocated_capacity._1_7_,
                                 value.field_2._M_local_buf[0]) + 1);
      }
      p_Var2 = p_Var7[2]._M_parent;
      for (p_Var7 = *(_Base_ptr *)(p_Var7 + 2); p_Var7 != p_Var2;
          p_Var7 = (_Base_ptr)&p_Var7->_M_parent) {
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        local_78._M_dataplus._M_p = (pointer)paVar1;
        psVar5 = cmCompiledGeneratorExpression::Evaluate
                           (*(cmCompiledGeneratorExpression **)p_Var7,local_50->LG,local_38,false,
                            (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                            (cmGeneratorExpressionDAGChecker *)0x0,&local_78);
        value._M_dataplus._M_p = (pointer)&value.field_2;
        pcVar3 = (psVar5->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&value,pcVar3,pcVar3 + psVar5->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        cmOutputConverter::EscapeForCMake(&local_78,&value);
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,local_78._M_dataplus._M_p,local_78._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value._M_dataplus._M_p != &value.field_2) {
          operator_delete(value._M_dataplus._M_p,
                          CONCAT71(value.field_2._M_allocated_capacity._1_7_,
                                   value.field_2._M_local_buf[0]) + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
      local_58 = (_Base_ptr)std::_Rb_tree_increment(local_58);
    } while (local_58 != local_48);
  }
  return;
}

Assistant:

void cmCPackPropertiesGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  std::string const& expandedFileName =
    this->InstalledFile.GetNameExpression().Evaluate(this->LG, config);

  cmInstalledFile::PropertyMapType const& properties =
    this->InstalledFile.GetProperties();

  for (cmInstalledFile::PropertyMapType::value_type const& i : properties) {
    std::string const& name = i.first;
    cmInstalledFile::Property const& property = i.second;

    os << indent << "set_property(INSTALL "
       << cmOutputConverter::EscapeForCMake(expandedFileName) << " PROPERTY "
       << cmOutputConverter::EscapeForCMake(name);

    for (cmInstalledFile::ExpressionVectorType::value_type const& j :
         property.ValueExpressions) {
      std::string value = j->Evaluate(this->LG, config);
      os << " " << cmOutputConverter::EscapeForCMake(value);
    }

    os << ")\n";
  }
}